

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

double __thiscall
duckdb::Interpolator<false>::Interpolate<unsigned_long,double,duckdb::QuantileIndirect<int>>
          (Interpolator<false> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<int> *accessor)

{
  RESULT_TYPE_conflict1 RVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  unsigned_long local_30;
  unsigned_long local_28;
  
  local_30 = hidx;
  local_28 = lidx;
  RVar1 = QuantileIndirect<int>::operator()(accessor,&local_28);
  dVar2 = Cast::Operation<int,double>(RVar1);
  if (lidx != hidx) {
    RVar1 = QuantileIndirect<int>::operator()(accessor,&local_30);
    dVar3 = Cast::Operation<int,double>(RVar1);
    dVar4 = this->RN -
            (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0));
    dVar2 = dVar2 * (1.0 - dVar4) + dVar4 * dVar3;
  }
  return dVar2;
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		if (lidx == hidx) {
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
		} else {
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(hidx), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}